

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_migrate.c
# Opt level: O0

REF_STATUS ref_migrate_shufflin_node(REF_NODE ref_node)

{
  int iVar1;
  uint uVar2;
  REF_GLOB local_b8;
  undefined8 local_b0;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT ref_malloc_init_i_1;
  REF_INT ref_malloc_init_i;
  REF_INT i;
  REF_INT local;
  REF_DBL *b_aux;
  REF_DBL *a_aux;
  REF_DBL *b_real;
  REF_DBL *a_real;
  REF_INT *a_next;
  REF_INT node;
  REF_INT part;
  REF_GLOB *b_global;
  REF_GLOB *a_global;
  REF_INT b_total;
  REF_INT a_total;
  REF_INT *b_size;
  REF_INT *a_size;
  REF_MPI ref_mpi;
  REF_NODE ref_node_local;
  
  a_size = &ref_node->ref_mpi->n;
  ref_mpi = (REF_MPI)ref_node;
  if (((REF_MPI)a_size)->n < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c",0x570
           ,"ref_migrate_shufflin_node","malloc a_size of REF_INT negative");
    ref_node_local._4_4_ = 1;
  }
  else {
    b_size = (REF_INT *)malloc((long)((REF_MPI)a_size)->n << 2);
    if (b_size == (REF_INT *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c",
             0x570,"ref_migrate_shufflin_node","malloc a_size of REF_INT NULL");
      ref_node_local._4_4_ = 2;
    }
    else {
      for (ref_private_macro_code_rss = 0; ref_private_macro_code_rss < *a_size;
          ref_private_macro_code_rss = ref_private_macro_code_rss + 1) {
        b_size[ref_private_macro_code_rss] = 0;
      }
      if (*a_size < 0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c",
               0x571,"ref_migrate_shufflin_node","malloc b_size of REF_INT negative");
        ref_node_local._4_4_ = 1;
      }
      else {
        _b_total = (REF_INT *)malloc((long)*a_size << 2);
        if (_b_total == (REF_INT *)0x0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                 ,0x571,"ref_migrate_shufflin_node","malloc b_size of REF_INT NULL");
          ref_node_local._4_4_ = 2;
        }
        else {
          for (ref_private_macro_code_rss_1 = 0; ref_private_macro_code_rss_1 < *a_size;
              ref_private_macro_code_rss_1 = ref_private_macro_code_rss_1 + 1) {
            _b_total[ref_private_macro_code_rss_1] = 0;
          }
          for (a_next._0_4_ = 0; (int)(uint)a_next < ref_mpi->id; a_next._0_4_ = (uint)a_next + 1) {
            if ((((-1 < (int)(uint)a_next) && ((int)(uint)a_next < ref_mpi->id)) &&
                (-1 < *(long *)((long)ref_mpi->comm + (long)(int)(uint)a_next * 8))) &&
               (a_size[1] !=
                *(int *)(*(long *)&ref_mpi->native_alltoallv + (long)(int)(uint)a_next * 4))) {
              if ((*(int *)(*(long *)&ref_mpi->native_alltoallv + (long)(int)(uint)a_next * 4) < 0)
                 || (*a_size <=
                     *(int *)(*(long *)&ref_mpi->native_alltoallv + (long)(int)(uint)a_next * 4))) {
                if (((int)(uint)a_next < 0) ||
                   ((ref_mpi->id <= (int)(uint)a_next ||
                    (*(long *)((long)ref_mpi->comm + (long)(int)(uint)a_next * 8) < 0)))) {
                  local_b0 = 0xffffffffffffffff;
                }
                else {
                  local_b0 = *(undefined8 *)((long)ref_mpi->comm + (long)(int)(uint)a_next * 8);
                }
                printf("id %d node %d global %ld part %d ",(ulong)(uint)a_size[1],
                       (ulong)(uint)a_next,local_b0,
                       (ulong)*(uint *)(*(long *)&ref_mpi->native_alltoallv +
                                       (long)(int)(uint)a_next * 4));
                printf("%s: %d: %s: %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                       ,0x57a,"ref_migrate_shufflin_node","part out of range");
                return 1;
              }
              iVar1 = *(int *)(*(long *)&ref_mpi->native_alltoallv + (long)(int)(uint)a_next * 4);
              b_size[iVar1] = b_size[iVar1] + 1;
            }
          }
          uVar2 = ref_mpi_alltoall((REF_MPI)a_size,b_size,_b_total,1);
          if (uVar2 == 0) {
            a_global._4_4_ = 0;
            for (a_next._4_4_ = 0; a_next._4_4_ < *a_size; a_next._4_4_ = a_next._4_4_ + 1) {
              a_global._4_4_ = b_size[a_next._4_4_] + a_global._4_4_;
            }
            if (a_global._4_4_ < 0) {
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                     ,0x585,"ref_migrate_shufflin_node","malloc a_global of REF_GLOB negative");
              ref_node_local._4_4_ = 1;
            }
            else {
              b_global = (REF_GLOB *)malloc((long)a_global._4_4_ << 3);
              if (b_global == (REF_GLOB *)0x0) {
                printf("%s: %d: %s: %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                       ,0x585,"ref_migrate_shufflin_node","malloc a_global of REF_GLOB NULL");
                ref_node_local._4_4_ = 2;
              }
              else if (a_global._4_4_ * 0xf < 0) {
                printf("%s: %d: %s: %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                       ,0x586,"ref_migrate_shufflin_node","malloc a_real of REF_DBL negative");
                ref_node_local._4_4_ = 1;
              }
              else {
                b_real = (REF_DBL *)malloc((long)(a_global._4_4_ * 0xf) << 3);
                if (b_real == (REF_DBL *)0x0) {
                  printf("%s: %d: %s: %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                         ,0x586,"ref_migrate_shufflin_node","malloc a_real of REF_DBL NULL");
                  ref_node_local._4_4_ = 2;
                }
                else {
                  b_aux = (REF_DBL *)0x0;
                  if (0 < ref_mpi[1].max_tag) {
                    if (ref_mpi[1].max_tag * a_global._4_4_ < 0) {
                      printf("%s: %d: %s: %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                             ,0x589,"ref_migrate_shufflin_node","malloc a_aux of REF_DBL negative");
                      return 1;
                    }
                    b_aux = (REF_DBL *)malloc((long)(ref_mpi[1].max_tag * a_global._4_4_) << 3);
                    if (b_aux == (REF_DBL *)0x0) {
                      printf("%s: %d: %s: %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                             ,0x589,"ref_migrate_shufflin_node","malloc a_aux of REF_DBL NULL");
                      return 2;
                    }
                  }
                  a_global._0_4_ = 0;
                  for (a_next._4_4_ = 0; a_next._4_4_ < *a_size; a_next._4_4_ = a_next._4_4_ + 1) {
                    a_global._0_4_ = _b_total[a_next._4_4_] + (int)a_global;
                  }
                  if ((int)a_global < 0) {
                    printf("%s: %d: %s: %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                           ,0x58d,"ref_migrate_shufflin_node","malloc b_global of REF_GLOB negative"
                          );
                    ref_node_local._4_4_ = 1;
                  }
                  else {
                    _node = (REF_GLOB *)malloc((long)(int)a_global << 3);
                    if (_node == (REF_GLOB *)0x0) {
                      printf("%s: %d: %s: %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                             ,0x58d,"ref_migrate_shufflin_node","malloc b_global of REF_GLOB NULL");
                      ref_node_local._4_4_ = 2;
                    }
                    else if ((int)a_global * 0xf < 0) {
                      printf("%s: %d: %s: %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                             ,0x58e,"ref_migrate_shufflin_node","malloc b_real of REF_DBL negative")
                      ;
                      ref_node_local._4_4_ = 1;
                    }
                    else {
                      a_aux = (REF_DBL *)malloc((long)((int)a_global * 0xf) << 3);
                      if (a_aux == (REF_DBL *)0x0) {
                        printf("%s: %d: %s: %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                               ,0x58e,"ref_migrate_shufflin_node","malloc b_real of REF_DBL NULL");
                        ref_node_local._4_4_ = 2;
                      }
                      else {
                        _i = (void *)0x0;
                        if (0 < ref_mpi[1].max_tag) {
                          if (ref_mpi[1].max_tag * (int)a_global < 0) {
                            printf("%s: %d: %s: %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                                   ,0x591,"ref_migrate_shufflin_node",
                                   "malloc b_aux of REF_DBL negative");
                            return 1;
                          }
                          _i = malloc((long)(ref_mpi[1].max_tag * (int)a_global) << 3);
                          if (_i == (void *)0x0) {
                            printf("%s: %d: %s: %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                                   ,0x591,"ref_migrate_shufflin_node","malloc b_aux of REF_DBL NULL"
                                  );
                            return 2;
                          }
                        }
                        if (*a_size < 0) {
                          printf("%s: %d: %s: %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                                 ,0x593,"ref_migrate_shufflin_node",
                                 "malloc a_next of REF_INT negative");
                          ref_node_local._4_4_ = 1;
                        }
                        else {
                          a_real = (REF_DBL *)malloc((long)*a_size << 2);
                          if (a_real == (REF_DBL *)0x0) {
                            printf("%s: %d: %s: %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                                   ,0x593,"ref_migrate_shufflin_node",
                                   "malloc a_next of REF_INT NULL");
                            ref_node_local._4_4_ = 2;
                          }
                          else {
                            *(undefined4 *)a_real = 0;
                            for (a_next._4_4_ = 1; a_next._4_4_ < *a_size;
                                a_next._4_4_ = a_next._4_4_ + 1) {
                              *(int *)((long)a_real + (long)a_next._4_4_ * 4) =
                                   *(int *)((long)a_real + (long)(a_next._4_4_ + -1) * 4) +
                                   b_size[a_next._4_4_ + -1];
                            }
                            for (a_next._0_4_ = 0; (int)(uint)a_next < ref_mpi->id;
                                a_next._0_4_ = (uint)a_next + 1) {
                              if ((((-1 < (int)(uint)a_next) && ((int)(uint)a_next < ref_mpi->id))
                                  && (-1 < *(long *)((long)ref_mpi->comm +
                                                    (long)(int)(uint)a_next * 8))) &&
                                 (a_size[1] !=
                                  *(int *)(*(long *)&ref_mpi->native_alltoallv +
                                          (long)(int)(uint)a_next * 4))) {
                                a_next._4_4_ = *(int *)(*(long *)&ref_mpi->native_alltoallv +
                                                       (long)(int)(uint)a_next * 4);
                                if ((((int)(uint)a_next < 0) || (ref_mpi->id <= (int)(uint)a_next))
                                   || (*(long *)((long)ref_mpi->comm + (long)(int)(uint)a_next * 8)
                                       < 0)) {
                                  local_b8 = -1;
                                }
                                else {
                                  local_b8 = *(REF_GLOB *)
                                              ((long)ref_mpi->comm + (long)(int)(uint)a_next * 8);
                                }
                                b_global[*(int *)((long)a_real + (long)a_next._4_4_ * 4)] = local_b8
                                ;
                                for (ref_malloc_init_i_1 = 0; ref_malloc_init_i_1 < 0xf;
                                    ref_malloc_init_i_1 = ref_malloc_init_i_1 + 1) {
                                  b_real[ref_malloc_init_i_1 +
                                         *(int *)((long)a_real + (long)a_next._4_4_ * 4) * 0xf] =
                                       *(REF_DBL *)
                                        (*(long *)(ref_mpi + 1) +
                                        (long)(int)(ref_malloc_init_i_1 + (uint)a_next * 0xf) * 8);
                                }
                                for (ref_malloc_init_i_1 = 0;
                                    ref_malloc_init_i_1 < ref_mpi[1].max_tag;
                                    ref_malloc_init_i_1 = ref_malloc_init_i_1 + 1) {
                                  b_aux[ref_malloc_init_i_1 +
                                        ref_mpi[1].max_tag *
                                        *(int *)((long)a_real + (long)a_next._4_4_ * 4)] =
                                       *(REF_DBL *)
                                        ((long)ref_mpi[1].comm +
                                        (long)(int)(ref_malloc_init_i_1 +
                                                   ref_mpi[1].max_tag * (uint)a_next) * 8);
                                }
                                *(int *)((long)a_real + (long)a_next._4_4_ * 4) =
                                     *(int *)((long)a_real + (long)a_next._4_4_ * 4) + 1;
                              }
                            }
                            uVar2 = ref_mpi_alltoallv((REF_MPI)a_size,b_global,b_size,_node,_b_total
                                                      ,1,2);
                            if (uVar2 == 0) {
                              uVar2 = ref_mpi_alltoallv((REF_MPI)a_size,b_real,b_size,a_aux,_b_total
                                                        ,0xf,3);
                              if (uVar2 == 0) {
                                if ((ref_mpi[1].max_tag < 1) ||
                                   (uVar2 = ref_mpi_alltoallv((REF_MPI)a_size,b_aux,b_size,_i,
                                                              _b_total,ref_mpi[1].max_tag,3),
                                   uVar2 == 0)) {
                                  uVar2 = ref_node_add_many((REF_NODE)ref_mpi,(int)a_global,_node);
                                  if (uVar2 == 0) {
                                    for (a_next._0_4_ = 0; (int)(uint)a_next < (int)a_global;
                                        a_next._0_4_ = (uint)a_next + 1) {
                                      uVar2 = ::ref_node_local((REF_NODE)ref_mpi,
                                                               _node[(int)(uint)a_next],
                                                               &ref_malloc_init_i);
                                      if (uVar2 != 0) {
                                        printf("%s: %d: %s: %d %s\n",
                                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                                               ,0x5b6,"ref_migrate_shufflin_node",(ulong)uVar2,
                                               "local");
                                        return uVar2;
                                      }
                                      for (ref_malloc_init_i_1 = 0; ref_malloc_init_i_1 < 0xf;
                                          ref_malloc_init_i_1 = ref_malloc_init_i_1 + 1) {
                                        *(REF_DBL *)
                                         (*(long *)(ref_mpi + 1) +
                                         (long)(ref_malloc_init_i_1 + ref_malloc_init_i * 0xf) * 8)
                                             = a_aux[(int)(ref_malloc_init_i_1 + (uint)a_next * 0xf)
                                                    ];
                                      }
                                      for (ref_malloc_init_i_1 = 0;
                                          ref_malloc_init_i_1 < ref_mpi[1].max_tag;
                                          ref_malloc_init_i_1 = ref_malloc_init_i_1 + 1) {
                                        *(undefined8 *)
                                         ((long)ref_mpi[1].comm +
                                         (long)(ref_malloc_init_i_1 +
                                               ref_mpi[1].max_tag * ref_malloc_init_i) * 8) =
                                             *(undefined8 *)
                                              ((long)_i +
                                              (long)(int)(ref_malloc_init_i_1 +
                                                         ref_mpi[1].max_tag * (uint)a_next) * 8);
                                      }
                                      *(REF_INT *)
                                       (*(long *)&ref_mpi->native_alltoallv +
                                       (long)ref_malloc_init_i * 4) = a_size[1];
                                    }
                                    if (a_real != (REF_DBL *)0x0) {
                                      free(a_real);
                                    }
                                    if (_i != (void *)0x0) {
                                      free(_i);
                                    }
                                    if (a_aux != (REF_DBL *)0x0) {
                                      free(a_aux);
                                    }
                                    if (_node != (REF_GLOB *)0x0) {
                                      free(_node);
                                    }
                                    if (b_aux != (REF_DBL *)0x0) {
                                      free(b_aux);
                                    }
                                    if (b_real != (REF_DBL *)0x0) {
                                      free(b_real);
                                    }
                                    if (b_global != (REF_GLOB *)0x0) {
                                      free(b_global);
                                    }
                                    if (_b_total != (REF_INT *)0x0) {
                                      free(_b_total);
                                    }
                                    if (b_size != (REF_INT *)0x0) {
                                      free(b_size);
                                    }
                                    ref_node_local._4_4_ = 0;
                                  }
                                  else {
                                    printf("%s: %d: %s: %d %s\n",
                                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                                           ,0x5b3,"ref_migrate_shufflin_node",(ulong)uVar2,
                                           "add many");
                                    ref_node_local._4_4_ = uVar2;
                                  }
                                }
                                else {
                                  printf("%s: %d: %s: %d %s\n",
                                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                                         ,0x5b1,"ref_migrate_shufflin_node",(ulong)uVar2,
                                         "alltoallv aux");
                                  ref_node_local._4_4_ = uVar2;
                                }
                              }
                              else {
                                printf("%s: %d: %s: %d %s\n",
                                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                                       ,0x5ac,"ref_migrate_shufflin_node",(ulong)uVar2,
                                       "alltoallv real");
                                ref_node_local._4_4_ = uVar2;
                              }
                            }
                            else {
                              printf("%s: %d: %s: %d %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                                     ,0x5a8,"ref_migrate_shufflin_node",(ulong)uVar2,
                                     "alltoallv global");
                              ref_node_local._4_4_ = uVar2;
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                   ,0x581,"ref_migrate_shufflin_node",(ulong)uVar2,"alltoall sizes");
            ref_node_local._4_4_ = uVar2;
          }
        }
      }
    }
  }
  return ref_node_local._4_4_;
}

Assistant:

REF_FCN static REF_STATUS ref_migrate_shufflin_node(REF_NODE ref_node) {
  REF_MPI ref_mpi = ref_node_mpi(ref_node);
  REF_INT *a_size, *b_size;
  REF_INT a_total, b_total;
  REF_GLOB *a_global, *b_global;
  REF_INT part, node;
  REF_INT *a_next;
  REF_DBL *a_real, *b_real;
  REF_DBL *a_aux, *b_aux;
  REF_INT local;
  REF_INT i;

  ref_malloc_init(a_size, ref_mpi_n(ref_mpi), REF_INT, 0);
  ref_malloc_init(b_size, ref_mpi_n(ref_mpi), REF_INT, 0);

  each_ref_node_valid_node(ref_node, node) {
    if (ref_mpi_rank(ref_mpi) != ref_node_part(ref_node, node)) {
      if (ref_node_part(ref_node, node) < 0 ||
          ref_node_part(ref_node, node) >= ref_mpi_n(ref_mpi)) {
        printf("id %d node %d global " REF_GLOB_FMT " part %d ",
               ref_mpi_rank(ref_mpi), node, ref_node_global(ref_node, node),
               ref_node_part(ref_node, node));
        THROW("part out of range");
      }
      a_size[ref_node_part(ref_node, node)]++;
    }
  }

  RSS(ref_mpi_alltoall(ref_mpi, a_size, b_size, REF_INT_TYPE),
      "alltoall sizes");

  a_total = 0;
  each_ref_mpi_part(ref_mpi, part) a_total += a_size[part];
  ref_malloc(a_global, a_total, REF_GLOB);
  ref_malloc(a_real, REF_NODE_REAL_PER * a_total, REF_DBL);
  a_aux = NULL;
  if (ref_node_naux(ref_node) > 0)
    ref_malloc(a_aux, ref_node_naux(ref_node) * a_total, REF_DBL);

  b_total = 0;
  each_ref_mpi_part(ref_mpi, part) b_total += b_size[part];
  ref_malloc(b_global, b_total, REF_GLOB);
  ref_malloc(b_real, REF_NODE_REAL_PER * b_total, REF_DBL);
  b_aux = NULL;
  if (ref_node_naux(ref_node) > 0)
    ref_malloc(b_aux, ref_node_naux(ref_node) * b_total, REF_DBL);

  ref_malloc(a_next, ref_mpi_n(ref_mpi), REF_INT);
  a_next[0] = 0;
  each_ref_mpi_worker(ref_mpi, part) a_next[part] =
      a_next[part - 1] + a_size[part - 1];

  each_ref_node_valid_node(ref_node, node) {
    if (ref_mpi_rank(ref_mpi) != ref_node_part(ref_node, node)) {
      part = ref_node_part(ref_node, node);
      a_global[a_next[part]] = ref_node_global(ref_node, node);
      for (i = 0; i < REF_NODE_REAL_PER; i++)
        a_real[i + REF_NODE_REAL_PER * a_next[part]] =
            ref_node_real(ref_node, i, node);
      for (i = 0; i < ref_node_naux(ref_node); i++)
        a_aux[i + ref_node_naux(ref_node) * a_next[part]] =
            ref_node_aux(ref_node, i, node);
      a_next[part]++;
    }
  }

  RSS(ref_mpi_alltoallv(ref_mpi, a_global, a_size, b_global, b_size, 1,
                        REF_GLOB_TYPE),
      "alltoallv global");

  RSS(ref_mpi_alltoallv(ref_mpi, a_real, a_size, b_real, b_size,
                        REF_NODE_REAL_PER, REF_DBL_TYPE),
      "alltoallv real");

  if (ref_node_naux(ref_node) > 0)
    RSS(ref_mpi_alltoallv(ref_mpi, a_aux, a_size, b_aux, b_size,
                          ref_node_naux(ref_node), REF_DBL_TYPE),
        "alltoallv aux");

  RSS(ref_node_add_many(ref_node, b_total, b_global), "add many");

  for (node = 0; node < b_total; node++) {
    RSS(ref_node_local(ref_node, b_global[node], &local), "local");
    for (i = 0; i < REF_NODE_REAL_PER; i++)
      ref_node_real(ref_node, i, local) = b_real[i + REF_NODE_REAL_PER * node];
    for (i = 0; i < ref_node_naux(ref_node); i++)
      ref_node_aux(ref_node, i, local) =
          b_aux[i + ref_node_naux(ref_node) * node];
    ref_node_part(ref_node, local) = ref_mpi_rank(ref_mpi);
  }

  ref_free(a_next);
  ref_free(b_aux);
  ref_free(b_real);
  ref_free(b_global);
  ref_free(a_aux);
  ref_free(a_real);
  ref_free(a_global);
  ref_free(b_size);
  ref_free(a_size);

  return REF_SUCCESS;
}